

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg.cc
# Opt level: O0

void __thiscall
tchecker::zg::zg_t::split
          (zg_t *this,const_state_sptr_t *s,clock_constraint_t *c,
          vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
          *v)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  clock_constraint_t *c_00;
  bool bVar2;
  state_t *psVar3;
  zone_t *pzVar4;
  db_t *pdVar5;
  size_t sVar6;
  undefined1 local_68 [12];
  clock_constraint_t local_5c;
  clock_constraint_t local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
  *v_local;
  clock_constraint_t *c_local;
  const_state_sptr_t *s_local;
  zg_t *this_local;
  
  local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)v;
  v_local = (vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
             *)c;
  c_local = (clock_constraint_t *)s;
  s_local = (const_state_sptr_t *)this;
  psVar3 = &intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
            ::operator->(s)->super_state_t;
  pzVar4 = state_t::zone(psVar3);
  pdVar5 = zone_t::dbm(pzVar4);
  psVar3 = &intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
            ::operator->((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                          *)c_local)->super_state_t;
  pzVar4 = state_t::zone(psVar3);
  sVar6 = zone_t::dim(pzVar4);
  bVar2 = tchecker::dbm::satisfies(pdVar5,(clock_id_t)sVar6,(clock_constraint_t *)v_local);
  c_00 = c_local;
  _Var1._M_pi = local_28._M_pi;
  if (!bVar2) {
    local_40 = tchecker::operator-((clock_constraint_t *)v_local);
    clone_and_constrain((zg_t *)&stack0xffffffffffffffd0,(const_state_sptr_t *)this,c_00);
    std::
    vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
    ::push_back((vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
                 *)_Var1._M_pi,(value_type *)&stack0xffffffffffffffd0);
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>::
    ~intrusive_shared_ptr_t
              ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                *)&stack0xffffffffffffffd0);
  }
  psVar3 = &intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
            ::operator->((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                          *)c_local)->super_state_t;
  pzVar4 = state_t::zone(psVar3);
  pdVar5 = zone_t::dbm(pzVar4);
  psVar3 = &intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
            ::operator->((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                          *)c_local)->super_state_t;
  pzVar4 = state_t::zone(psVar3);
  sVar6 = zone_t::dim(pzVar4);
  local_5c = tchecker::operator-((clock_constraint_t *)v_local);
  bVar2 = tchecker::dbm::satisfies(pdVar5,(clock_id_t)sVar6,&local_5c);
  _Var1._M_pi = local_28._M_pi;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    clone_and_constrain((zg_t *)local_68,(const_state_sptr_t *)this,c_local);
    std::
    vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
    ::push_back((vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
                 *)_Var1._M_pi,(value_type *)local_68);
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>::
    ~intrusive_shared_ptr_t
              ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                *)local_68);
  }
  return;
}

Assistant:

void zg_t::split(tchecker::zg::const_state_sptr_t const & s, tchecker::clock_constraint_t const & c,
                 std::vector<tchecker::zg::state_sptr_t> & v)
{
  if (!tchecker::dbm::satisfies(s->zone().dbm(), s->zone().dim(), c))
    v.push_back(clone_and_constrain(s, -c));
  if (!tchecker::dbm::satisfies(s->zone().dbm(), s->zone().dim(), -c))
    v.push_back(clone_and_constrain(s, c));
}